

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QtCbor::Element>::erase
          (QPodArrayOps<QtCbor::Element> *this,Element *b,qsizetype n)

{
  Element *__src;
  QArrayDataPointer<QtCbor::Element> *pQVar1;
  Element *pEVar2;
  long in_RDX;
  QArrayDataPointer<QtCbor::Element> *in_RSI;
  long in_RDI;
  Element *e;
  QArrayDataPointer<QtCbor::Element> *in_stack_ffffffffffffffb0;
  
  __src = (Element *)(&in_RSI->d + in_RDX * 2);
  pQVar1 = (QArrayDataPointer<QtCbor::Element> *)
           QArrayDataPointer<QtCbor::Element>::begin((QArrayDataPointer<QtCbor::Element> *)0x132816)
  ;
  if ((in_RSI == pQVar1) &&
     (pEVar2 = QArrayDataPointer<QtCbor::Element>::end(in_stack_ffffffffffffffb0), __src != pEVar2))
  {
    *(Element **)(in_RDI + 8) = __src;
  }
  else {
    pEVar2 = QArrayDataPointer<QtCbor::Element>::end(in_stack_ffffffffffffffb0);
    if (__src != pEVar2) {
      pEVar2 = QArrayDataPointer<QtCbor::Element>::end(in_RSI);
      memmove(in_RSI,__src,((long)pEVar2 - (long)__src >> 4) << 4);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }